

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O3

void __thiscall
CS248::StaticScene::InfiniteHemisphereLight::InfiniteHemisphereLight
          (InfiniteHemisphereLight *this,Spectrum *rad)

{
  Matrix3x3 *this_00;
  float fVar1;
  Vector3D *pVVar2;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_is_delta_light_00248058;
  fVar1 = rad->g;
  (this->radiance).r = rad->r;
  (this->radiance).g = fVar1;
  (this->radiance).b = rad->b;
  this_00 = &this->sampleToWorld;
  (this->sampleToWorld).entries[0].x = 0.0;
  (this->sampleToWorld).entries[0].y = 0.0;
  (this->sampleToWorld).entries[0].z = 0.0;
  (this->sampleToWorld).entries[1].x = 0.0;
  (this->sampleToWorld).entries[1].y = 0.0;
  (this->sampleToWorld).entries[1].z = 0.0;
  (this->sampleToWorld).entries[2].x = 0.0;
  (this->sampleToWorld).entries[2].y = 0.0;
  (this->sampleToWorld).entries[2].z = 0.0;
  pVVar2 = Matrix3x3::operator[](this_00,0);
  pVVar2->x = 1.0;
  pVVar2->y = 0.0;
  pVVar2->z = 0.0;
  pVVar2 = Matrix3x3::operator[](this_00,1);
  pVVar2->x = 0.0;
  pVVar2->y = 0.0;
  pVVar2->z = -1.0;
  pVVar2 = Matrix3x3::operator[](this_00,2);
  *(undefined4 *)&pVVar2->x = 0;
  *(undefined4 *)((long)&pVVar2->x + 4) = 0;
  *(undefined4 *)&pVVar2->y = 0;
  *(undefined4 *)((long)&pVVar2->y + 4) = 0x3ff00000;
  pVVar2->z = 0.0;
  return;
}

Assistant:

InfiniteHemisphereLight::InfiniteHemisphereLight(const Spectrum& rad)
    : radiance(rad) {
  sampleToWorld[0] = Vector3D(1, 0, 0);
  sampleToWorld[1] = Vector3D(0, 0, -1);
  sampleToWorld[2] = Vector3D(0, 1, 0);
}